

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O2

int __thiscall
JetHead::CircularBuffer::waitForFreeSpace(CircularBuffer *this,int threshold,uint32_t msecs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint32_t timeoutms;
  timespec cur;
  timespec start;
  AutoLock lock;
  timespec local_68;
  timespec local_58;
  AutoLock local_48;
  
  TimeUtils::getCurTime(&local_58);
  AutoLock::AutoLock(&local_48,&this->mLock);
  timeoutms = msecs;
  do {
    iVar3 = this->mBufferSize - this->mLen;
    if (threshold <= iVar3) {
LAB_00116d9b:
      iVar1 = 0;
      if (threshold <= iVar3) {
        iVar1 = iVar3;
      }
      AutoLock::~AutoLock(&local_48);
      return iVar1;
    }
    bVar2 = Condition::Wait(&this->mFreeCondition,&this->mLock,timeoutms);
    if (!bVar2) {
      iVar3 = this->mBufferSize - this->mLen;
      goto LAB_00116d9b;
    }
    TimeUtils::getCurTime(&local_68);
    timeoutms = msecs - (((int)local_68.tv_sec - (int)local_58.tv_sec) * 1000 +
                        (int)((local_68.tv_nsec - local_58.tv_nsec) / 1000000));
  } while( true );
}

Assistant:

int CircularBuffer::waitForFreeSpace( int threshold, uint32_t msecs )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	uint32_t timeout = msecs;	
	struct timespec start, cur;
	TimeUtils::getCurTime( &start );
	
	LOG( "Wating for data %d cur size %d timeout %d", threshold, length_internal(), msecs );

	AutoLock lock( mLock );
	
	if ( mBufferSize - length_internal() < threshold )
		LOG_INFO( "buffer underflow" );
	
	while ( mBufferSize - length_internal() < threshold && mFreeCondition.Wait( mLock, timeout ) )
	{
		TimeUtils::getCurTime( &cur );
		timeout = msecs - TimeUtils::getDifference( &cur, &start );
		
		LOG( "Wating for data %d cur size %d msecs remaining %d", threshold, length_internal(), timeout );
	}

	if ( mBufferSize - length_internal() >= threshold )
		return mBufferSize - length_internal();
	else
		return 0;
}